

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O1

void * __thiscall FMemArena::Alloc(FMemArena *this,size_t size)

{
  Block *pBVar1;
  void *pvVar2;
  void *pvVar3;
  
  pBVar1 = (Block *)this;
  do {
    pBVar1 = pBVar1->NextBlock;
    if (pBVar1 == (Block *)0x0) {
      pBVar1 = AddBlock(this,size);
      pvVar2 = pBVar1->Avail;
      pvVar3 = (void *)(size + (long)pvVar2);
      if (pBVar1->Limit < pvVar3) {
        return (void *)0x0;
      }
      pBVar1->Avail = (void *)((long)pvVar3 + 7U & 0xfffffffffffffff8);
      return pvVar2;
    }
    pvVar2 = pBVar1->Avail;
    if (pBVar1->Limit < (void *)((long)pvVar2 + size)) {
      pvVar2 = (void *)0x0;
    }
    else {
      pBVar1->Avail = (void *)((long)((long)pvVar2 + size) + 7U & 0xfffffffffffffff8);
    }
  } while (pvVar2 == (void *)0x0);
  return pvVar2;
}

Assistant:

void *FMemArena::Alloc(size_t size)
{
	Block *block;

	for (block = TopBlock; block != NULL; block = block->NextBlock)
	{
		void *res = block->Alloc(size);
		if (res != NULL)
		{
			return res;
		}
	}
	block = AddBlock(size);
	return block->Alloc(size);
}